

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBTensorOp.cpp
# Opt level: O2

void __thiscall
amrex::MLEBTensorOp::compVelGrad
          (MLEBTensorOp *this,int amrlev,Array<MultiFab_*,_3> *fluxes,MultiFab *sol,Location loc)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  double *pdVar5;
  double *pdVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  int iVar38;
  long lVar39;
  FabType FVar40;
  EBFArrayBoxFactory *this_00;
  int *piVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  int iVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  long lVar53;
  long lVar54;
  long lVar55;
  long lVar56;
  long lVar57;
  long lVar58;
  long lVar59;
  long lVar60;
  long lVar61;
  long lVar62;
  long lVar63;
  long lVar64;
  long lVar65;
  long lVar66;
  long lVar67;
  long lVar68;
  long lVar69;
  long lVar70;
  long lVar71;
  long lVar72;
  long lVar73;
  long lVar74;
  int iVar75;
  long lVar76;
  long lVar77;
  long lVar78;
  long lVar79;
  long lVar80;
  long lVar81;
  long lVar82;
  long lVar83;
  long lVar84;
  int iVar85;
  long lVar86;
  long lVar87;
  long lVar88;
  long lVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  long local_588;
  long local_558;
  long local_530;
  long local_528;
  long local_520;
  long local_518;
  long local_510;
  long local_508;
  long local_500;
  long local_4f8;
  long local_4f0;
  double *local_4c8;
  long local_4a8;
  long local_4a0;
  long local_498;
  long local_490;
  long local_488;
  long local_480;
  long local_478;
  FabArray<amrex::EBCellFlagFab> *local_3a8;
  double *local_388;
  Array4<const_double> vfab;
  Box zbx;
  Box ybx;
  Box local_258;
  Box xbx;
  Array<FArrayBox,_3> fluxfab_tmp;
  Array4<double> dst;
  MFIter mfi;
  Elixir fzeli;
  Elixir fyeli;
  Elixir fxeli;
  Box local_60;
  MFItInfo local_44;
  
  if (FaceCentroid < loc) {
    Abort_host("MLEBTensorOp::compVelGrad() unknown location for VelGradients.");
  }
  local_3a8 = (FabArray<amrex::EBCellFlagFab> *)0x0;
  applyBCTensor(this,amrlev,0,sol,Inhomogeneous,Solution,
                (MLMGBndry *)
                (this->super_MLEBABecLap).super_MLCellABecLap.super_MLCellLinOp.m_bndry_sol.
                super_vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
                .
                super__Vector_base<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[amrlev]._M_t.
                super___uniq_ptr_impl<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>);
  lVar53 = **(long **)&(this->super_MLEBABecLap).super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp
                       .m_factory.
                       super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                       .
                       super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[amrlev].
                       super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                       .
                       super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
  ;
  if (lVar53 != 0) {
    local_3a8 = (FabArray<amrex::EBCellFlagFab> *)0x0;
    this_00 = (EBFArrayBoxFactory *)
              __dynamic_cast(lVar53,&FabFactory<amrex::FArrayBox>::typeinfo,
                             &EBFArrayBoxFactory::typeinfo,0);
    if (this_00 != (EBFArrayBoxFactory *)0x0) {
      local_3a8 = EBFArrayBoxFactory::getMultiEBCellFlagFab(this_00);
    }
  }
  lVar53 = *(long *)&(this->super_MLEBABecLap).super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.
                     m_geom.
                     super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[amrlev].
                     super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                     super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  dVar7 = *(double *)(lVar53 + 0x38);
  dVar8 = *(double *)(lVar53 + 0x40);
  dVar9 = *(double *)(lVar53 + 0x48);
  local_44.num_streams = Gpu::Device::max_gpu_streams;
  local_44.do_tiling = true;
  local_44.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
  local_44.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
  local_44.tilesize.vect[2] = DAT_006ddef0;
  local_44.dynamic = true;
  local_44.device_sync = true;
  std::array<amrex::FArrayBox,_3UL>::array(&fluxfab_tmp);
  MFIter::MFIter(&mfi,(FabArrayBase *)sol,&local_44);
  dVar91 = dVar8 * 0.25;
  dVar92 = dVar9 * 0.25;
  dVar90 = dVar7 * 0.25;
  do {
    if (mfi.endIndex <= mfi.currentIndex) {
      MFIter::~MFIter(&mfi);
      std::array<amrex::FArrayBox,_3UL>::~array(&fluxfab_tmp);
      return;
    }
    MFIter::tilebox(&local_60,&mfi);
    if (local_3a8 == (FabArray<amrex::EBCellFlagFab> *)0x0) {
LAB_005a97f6:
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&vfab,&sol->super_FabArray<amrex::FArrayBox>,&mfi);
      MFIter::nodaltilebox(&xbx,&mfi,0);
      MFIter::nodaltilebox(&ybx,&mfi,1);
      MFIter::nodaltilebox(&zbx,&mfi,2);
      FArrayBox::resize(fluxfab_tmp._M_elems,&xbx,9,(Arena *)0x0);
      FArrayBox::resize(fluxfab_tmp._M_elems + 1,&ybx,9,(Arena *)0x0);
      FArrayBox::resize(fluxfab_tmp._M_elems + 2,&zbx,9,(Arena *)0x0);
      BaseFab<double>::elixir<double,_0>(&fxeli,(BaseFab<double> *)&fluxfab_tmp);
      BaseFab<double>::elixir<double,_0>(&fyeli,&fluxfab_tmp._M_elems[1].super_BaseFab<double>);
      BaseFab<double>::elixir<double,_0>(&fzeli,&fluxfab_tmp._M_elems[2].super_BaseFab<double>);
      lVar56 = (long)fluxfab_tmp._M_elems[0].super_BaseFab<double>.domain.smallend.vect[2];
      lVar65 = (long)((fluxfab_tmp._M_elems[0].super_BaseFab<double>.domain.bigend.vect[2] -
                      fluxfab_tmp._M_elems[0].super_BaseFab<double>.domain.smallend.vect[2]) + 1);
      lVar42 = (long)xbx.smallend.vect[2];
      lVar80 = (long)xbx.smallend.vect[0] * 8;
      lVar66 = (long)fluxfab_tmp._M_elems[0].super_BaseFab<double>.domain.smallend.vect[1];
      lVar57 = (long)((fluxfab_tmp._M_elems[0].super_BaseFab<double>.domain.bigend.vect[1] -
                      fluxfab_tmp._M_elems[0].super_BaseFab<double>.domain.smallend.vect[1]) + 1);
      lVar72 = (long)((fluxfab_tmp._M_elems[0].super_BaseFab<double>.domain.bigend.vect[0] -
                      fluxfab_tmp._M_elems[0].super_BaseFab<double>.domain.smallend.vect[0]) + 1);
      lVar47 = (long)fluxfab_tmp._M_elems[1].super_BaseFab<double>.domain.smallend.vect[0];
      lVar67 = (long)fluxfab_tmp._M_elems[1].super_BaseFab<double>.domain.smallend.vect[1];
      lVar48 = (long)((fluxfab_tmp._M_elems[1].super_BaseFab<double>.domain.bigend.vect[1] -
                      fluxfab_tmp._M_elems[1].super_BaseFab<double>.domain.smallend.vect[1]) + 1);
      lVar68 = (long)fluxfab_tmp._M_elems[1].super_BaseFab<double>.domain.smallend.vect[2];
      lVar49 = (long)((fluxfab_tmp._M_elems[1].super_BaseFab<double>.domain.bigend.vect[2] -
                      fluxfab_tmp._M_elems[1].super_BaseFab<double>.domain.smallend.vect[2]) + 1);
      lVar69 = (long)fluxfab_tmp._M_elems[2].super_BaseFab<double>.domain.smallend.vect[1];
      lVar50 = (long)((fluxfab_tmp._M_elems[2].super_BaseFab<double>.domain.bigend.vect[1] -
                      fluxfab_tmp._M_elems[2].super_BaseFab<double>.domain.smallend.vect[1]) + 1);
      lVar70 = (long)fluxfab_tmp._M_elems[2].super_BaseFab<double>.domain.smallend.vect[2];
      local_4c8 = fluxfab_tmp._M_elems[0].super_BaseFab<double>.dptr +
                  ((long)xbx.smallend.vect[0] -
                  (long)fluxfab_tmp._M_elems[0].super_BaseFab<double>.domain.smallend.vect[0]);
      lVar51 = (long)((fluxfab_tmp._M_elems[2].super_BaseFab<double>.domain.bigend.vect[2] -
                      fluxfab_tmp._M_elems[2].super_BaseFab<double>.domain.smallend.vect[2]) + 1);
      iVar75 = xbx.smallend.vect[2] + -1;
      lVar53 = lVar42;
      iVar85 = xbx.smallend.vect[2];
      while (iVar85 = iVar85 + 1, lVar53 <= xbx.bigend.vect[2]) {
        lVar58 = (long)vfab.begin.x;
        lVar87 = vfab.kstride * (lVar53 - vfab.begin.z);
        lVar52 = vfab.kstride * 8;
        lVar76 = (iVar75 - vfab.begin.z) * lVar52;
        lVar86 = vfab.nstride * 0x10;
        lVar73 = (iVar85 - vfab.begin.z) * lVar52;
        lVar52 = lVar52 * (lVar53 - vfab.begin.z);
        lVar43 = lVar86 + lVar52 + lVar58 * -8 + lVar80;
        lVar44 = lVar52 + vfab.nstride * 8 + lVar58 * -8 + lVar80;
        lVar54 = lVar52 + lVar58 * -8 + lVar80;
        lVar52 = vfab.jstride * 8;
        lVar74 = (long)xbx.smallend.vect[1];
        while (lVar74 <= xbx.bigend.vect[1]) {
          if (xbx.bigend.vect[0] < xbx.smallend.vect[0]) {
            lVar74 = lVar74 + 1;
          }
          else {
            lVar59 = vfab.jstride * (lVar74 - vfab.begin.y);
            lVar88 = lVar74 + 1;
            lVar81 = (long)((int)lVar88 - vfab.begin.y);
            lVar61 = (long)((int)lVar74 + ~vfab.begin.y);
            lVar78 = (lVar74 - vfab.begin.y) * lVar52;
            lVar82 = lVar81 * lVar52;
            lVar62 = lVar61 * lVar52;
            lVar79 = lVar74 * 8;
            lVar84 = lVar74 * 8;
            lVar1 = lVar74 * 8;
            lVar71 = lVar74 * 8;
            lVar83 = lVar74 * 8;
            lVar55 = lVar74 * 8;
            lVar2 = lVar74 * 8;
            lVar3 = lVar74 * 8;
            lVar4 = lVar74 * 8;
            lVar63 = 0;
            do {
              lVar74 = (long)(((xbx.smallend.vect[0] + -1) - vfab.begin.x) + (int)lVar63);
              pdVar5 = vfab.p + lVar59 + lVar74 + lVar87;
              dVar10 = *(double *)((long)vfab.p + lVar63 * 8 + lVar78 + lVar44);
              dVar11 = pdVar5[vfab.nstride];
              dVar12 = *(double *)((long)vfab.p + lVar63 * 8 + lVar78 + lVar43);
              dVar13 = pdVar5[vfab.nstride * 2];
              dVar14 = *(double *)((long)vfab.p + lVar63 * 8 + lVar82 + lVar54);
              pdVar6 = vfab.p + lVar87 + vfab.jstride * lVar81 + lVar74;
              dVar15 = *pdVar6;
              dVar16 = *(double *)((long)vfab.p + lVar63 * 8 + lVar82 + lVar44);
              dVar17 = pdVar6[vfab.nstride];
              dVar18 = *(double *)((long)vfab.p + lVar63 * 8 + lVar82 + lVar43);
              dVar19 = pdVar6[vfab.nstride * 2];
              dVar20 = *(double *)((long)vfab.p + lVar63 * 8 + lVar62 + lVar54);
              pdVar6 = vfab.p + lVar87 + vfab.jstride * lVar61 + lVar74;
              dVar21 = *pdVar6;
              dVar22 = *(double *)((long)vfab.p + lVar63 * 8 + lVar62 + lVar44);
              dVar23 = pdVar6[vfab.nstride];
              dVar24 = *(double *)((long)vfab.p + lVar63 * 8 + lVar62 + lVar43);
              dVar25 = pdVar6[vfab.nstride * 2];
              dVar26 = *(double *)
                        ((long)vfab.p + lVar63 * 8 + lVar78 + lVar73 + lVar58 * -8 + lVar80);
              pdVar6 = vfab.p + lVar59 + lVar74 + ((int)(lVar53 + 1) - vfab.begin.z) * vfab.kstride;
              dVar27 = *pdVar6;
              dVar28 = *(double *)
                        ((long)vfab.p +
                        lVar63 * 8 + lVar78 + lVar73 + vfab.nstride * 8 + lVar58 * -8 + lVar80);
              dVar29 = pdVar6[vfab.nstride];
              dVar30 = *(double *)
                        ((long)vfab.p + lVar63 * 8 + lVar78 + lVar73 + lVar86 + lVar58 * -8 + lVar80
                        );
              dVar31 = pdVar6[vfab.nstride * 2];
              dVar32 = *(double *)
                        ((long)vfab.p + lVar63 * 8 + lVar78 + lVar76 + lVar58 * -8 + lVar80);
              pdVar6 = vfab.p + lVar59 + lVar74 + ((int)lVar53 + ~vfab.begin.z) * vfab.kstride;
              dVar33 = *pdVar6;
              dVar34 = *(double *)
                        ((long)vfab.p +
                        lVar63 * 8 + lVar78 + lVar76 + vfab.nstride * 8 + lVar58 * -8 + lVar80);
              dVar35 = pdVar6[vfab.nstride];
              dVar36 = *(double *)
                        ((long)vfab.p + lVar63 * 8 + lVar78 + lVar76 + lVar86 + lVar58 * -8 + lVar80
                        );
              dVar37 = pdVar6[vfab.nstride * 2];
              *(double *)
               ((long)local_4c8 +
               lVar63 * 8 + ((lVar42 - lVar56) * lVar57 * 8 + lVar66 * -8 + lVar79) * lVar72) =
                   (*(double *)((long)vfab.p + lVar63 * 8 + lVar78 + lVar54) - *pdVar5) * dVar7;
              *(double *)
               ((long)local_4c8 +
               lVar63 * 8 +
               ((lVar65 * 8 + lVar42 * 8 + lVar56 * -8) * lVar57 + lVar66 * -8 + lVar84) * lVar72) =
                   (dVar10 - dVar11) * dVar7;
              *(double *)
               ((long)local_4c8 +
               lVar63 * 8 +
               ((lVar65 * 0x10 + lVar42 * 8 + lVar56 * -8) * lVar57 + lVar66 * -8 + lVar1) * lVar72)
                   = (dVar12 - dVar13) * dVar7;
              *(double *)
               ((long)local_4c8 +
               lVar63 * 8 +
               ((lVar65 * 0x18 + lVar42 * 8 + lVar56 * -8) * lVar57 + lVar66 * -8 + lVar71) * lVar72
               ) = (((dVar14 + dVar15) - dVar20) - dVar21) * dVar91;
              *(double *)
               ((long)local_4c8 +
               lVar63 * 8 +
               ((lVar65 * 0x20 + lVar42 * 8 + lVar56 * -8) * lVar57 + lVar66 * -8 + lVar83) * lVar72
               ) = (((dVar16 + dVar17) - dVar22) - dVar23) * dVar91;
              *(double *)
               ((long)local_4c8 +
               lVar63 * 8 +
               ((lVar65 * 0x28 + lVar42 * 8 + lVar56 * -8) * lVar57 + lVar66 * -8 + lVar55) * lVar72
               ) = (((dVar18 + dVar19) - dVar24) - dVar25) * dVar91;
              *(double *)
               ((long)local_4c8 +
               lVar63 * 8 +
               ((lVar65 * 0x30 + lVar42 * 8 + lVar56 * -8) * lVar57 + lVar66 * -8 + lVar2) * lVar72)
                   = (((dVar26 + dVar27) - dVar32) - dVar33) * dVar92;
              *(double *)
               ((long)local_4c8 +
               lVar63 * 8 +
               ((lVar65 * 0x38 + lVar42 * 8 + lVar56 * -8) * lVar57 + lVar66 * -8 + lVar3) * lVar72)
                   = (((dVar28 + dVar29) - dVar34) - dVar35) * dVar92;
              *(double *)
               ((long)local_4c8 +
               lVar63 * 8 +
               ((lVar65 * 0x40 + lVar42 * 8 + lVar56 * -8) * lVar57 + lVar66 * -8 + lVar4) * lVar72)
                   = (((dVar30 + dVar31) - dVar36) - dVar37) * dVar92;
              lVar63 = lVar63 + 1;
              lVar74 = lVar88;
            } while ((xbx.bigend.vect[0] - xbx.smallend.vect[0]) + 1 != (int)lVar63);
          }
        }
        iVar75 = iVar75 + 1;
        local_4c8 = local_4c8 + lVar57 * lVar72;
        lVar53 = lVar53 + 1;
      }
      lVar57 = (long)ybx.smallend.vect[1];
      lVar42 = (long)ybx.smallend.vect[2];
      lVar53 = (long)((fluxfab_tmp._M_elems[1].super_BaseFab<double>.domain.bigend.vect[0] -
                      fluxfab_tmp._M_elems[1].super_BaseFab<double>.domain.smallend.vect[0]) + 1);
      lVar56 = (long)ybx.smallend.vect[0];
      local_4f0 = (lVar57 * 8 + (lVar42 - lVar68) * lVar48 * 8 + lVar67 * -8) * lVar53 + lVar56 * 8
                  + lVar47 * -8 + (long)fluxfab_tmp._M_elems[1].super_BaseFab<double>.dptr;
      local_4f8 = ((lVar49 * 8 + lVar42 * 8 + lVar68 * -8) * lVar48 + lVar57 * 8 + lVar67 * -8) *
                  lVar53 + lVar56 * 8 + lVar47 * -8 +
                  (long)fluxfab_tmp._M_elems[1].super_BaseFab<double>.dptr;
      local_500 = ((lVar49 * 0x10 + lVar42 * 8 + lVar68 * -8) * lVar48 + lVar57 * 8 + lVar67 * -8) *
                  lVar53 + lVar56 * 8 + lVar47 * -8 +
                  (long)fluxfab_tmp._M_elems[1].super_BaseFab<double>.dptr;
      local_508 = ((lVar49 * 0x18 + lVar42 * 8 + lVar68 * -8) * lVar48 + lVar57 * 8 + lVar67 * -8) *
                  lVar53 + lVar56 * 8 + lVar47 * -8 +
                  (long)fluxfab_tmp._M_elems[1].super_BaseFab<double>.dptr;
      local_510 = ((lVar49 * 0x20 + lVar42 * 8 + lVar68 * -8) * lVar48 + lVar57 * 8 + lVar67 * -8) *
                  lVar53 + lVar56 * 8 + lVar47 * -8 +
                  (long)fluxfab_tmp._M_elems[1].super_BaseFab<double>.dptr;
      local_518 = ((lVar49 * 0x28 + lVar42 * 8 + lVar68 * -8) * lVar48 + lVar57 * 8 + lVar67 * -8) *
                  lVar53 + lVar56 * 8 + lVar47 * -8 +
                  (long)fluxfab_tmp._M_elems[1].super_BaseFab<double>.dptr;
      local_520 = ((lVar49 * 0x30 + lVar42 * 8 + lVar68 * -8) * lVar48 + lVar57 * 8 + lVar67 * -8) *
                  lVar53 + lVar56 * 8 + lVar47 * -8 +
                  (long)fluxfab_tmp._M_elems[1].super_BaseFab<double>.dptr;
      local_528 = ((lVar49 * 0x38 + lVar42 * 8 + lVar68 * -8) * lVar48 + lVar57 * 8 + lVar67 * -8) *
                  lVar53 + lVar56 * 8 + lVar47 * -8 +
                  (long)fluxfab_tmp._M_elems[1].super_BaseFab<double>.dptr;
      local_530 = ((lVar49 * 0x40 + lVar42 * 8 + lVar68 * -8) * lVar48 + lVar57 * 8 + lVar67 * -8) *
                  lVar53 + lVar56 * 8 + lVar47 * -8 +
                  (long)fluxfab_tmp._M_elems[1].super_BaseFab<double>.dptr;
      lVar47 = (long)((fluxfab_tmp._M_elems[2].super_BaseFab<double>.domain.bigend.vect[0] -
                      fluxfab_tmp._M_elems[2].super_BaseFab<double>.domain.smallend.vect[0]) + 1);
      lVar48 = lVar48 * lVar53 * 8;
      lVar53 = lVar53 * 8;
      iVar75 = ybx.smallend.vect[2] + -1;
      iVar85 = ybx.smallend.vect[2];
      while (iVar85 = iVar85 + 1, lVar42 <= ybx.bigend.vect[2]) {
        lVar43 = (long)vfab.begin.x;
        lVar76 = vfab.kstride * (lVar42 - vfab.begin.z);
        lVar66 = vfab.jstride * 8;
        lVar72 = (lVar57 - vfab.begin.y) * lVar66;
        lVar88 = vfab.kstride * 8;
        lVar54 = (iVar75 - vfab.begin.z) * lVar88;
        lVar49 = lVar72 + lVar54;
        lVar74 = vfab.nstride * 0x10;
        lVar73 = (iVar85 - vfab.begin.z) * lVar88;
        lVar88 = lVar88 * (lVar42 - vfab.begin.z);
        lVar65 = lVar72 + lVar73;
        lVar72 = lVar72 + lVar88;
        local_4a0 = (long)vfab.p + lVar49 + lVar74 + lVar43 * -8 + lVar56 * 8;
        lVar67 = (long)vfab.p + lVar49 + vfab.nstride * 8 + lVar43 * -8 + lVar56 * 8;
        lVar87 = (long)vfab.p + lVar49 + lVar43 * -8 + lVar56 * 8;
        lVar49 = (long)vfab.p + lVar65 + lVar74 + lVar43 * -8 + lVar56 * 8;
        lVar68 = (long)vfab.p + lVar65 + vfab.nstride * 8 + lVar43 * -8 + lVar56 * 8;
        lVar65 = (long)vfab.p + lVar65 + lVar43 * -8 + lVar56 * 8;
        lVar86 = (long)vfab.p + lVar72 + lVar74 + lVar43 * -8 + lVar56 * 8 + 8;
        lVar44 = (long)vfab.p + lVar72 + vfab.nstride * 8 + lVar43 * -8 + lVar56 * 8 + 8;
        lVar58 = (long)vfab.p + lVar72 + lVar43 * -8 + lVar56 * 8 + 8;
        lVar42 = lVar42 + 1;
        iVar46 = (ybx.smallend.vect[1] + -1) - vfab.begin.y;
        local_498 = local_520;
        local_558 = local_518;
        local_478 = local_510;
        local_480 = local_508;
        local_488 = local_500;
        local_490 = local_4f8;
        local_4a8 = local_4f0;
        lVar80 = local_530;
        lVar52 = local_528;
        for (lVar72 = lVar57; lVar72 <= ybx.bigend.vect[1]; lVar72 = lVar72 + 1) {
          if (ybx.smallend.vect[0] <= ybx.bigend.vect[0]) {
            lVar71 = iVar46 * lVar66;
            lVar79 = lVar71 + lVar74 + lVar88 + lVar43 * -8 + lVar56 * 8;
            lVar84 = lVar71 + lVar88 + vfab.nstride * 8 + lVar43 * -8 + lVar56 * 8;
            lVar1 = lVar71 + lVar88 + lVar43 * -8 + lVar56 * 8;
            lVar83 = 0;
            do {
              lVar55 = (long)(((ybx.smallend.vect[0] + -1) - vfab.begin.x) + (int)lVar83);
              pdVar5 = vfab.p + (lVar72 - vfab.begin.y) * vfab.jstride + lVar76 + lVar55;
              dVar10 = *(double *)(lVar44 + lVar83 * 8);
              dVar11 = *(double *)((long)vfab.p + lVar83 * 8 + lVar84 + 8);
              dVar12 = pdVar5[vfab.nstride];
              dVar13 = *(double *)(lVar86 + lVar83 * 8);
              dVar14 = *(double *)((long)vfab.p + lVar83 * 8 + lVar79 + 8);
              dVar15 = pdVar5[vfab.nstride * 2];
              pdVar6 = vfab.p + (~vfab.begin.y + (int)lVar72) * vfab.jstride + lVar76 + lVar55;
              dVar16 = pdVar6[vfab.nstride];
              dVar17 = pdVar6[vfab.nstride * 2];
              dVar18 = *(double *)(lVar58 + -8 + lVar83 * 8);
              dVar19 = *(double *)(lVar44 + -8 + lVar83 * 8);
              dVar20 = *(double *)(lVar86 + -8 + lVar83 * 8);
              dVar21 = *(double *)((long)vfab.p + lVar83 * 8 + lVar1);
              dVar22 = *(double *)((long)vfab.p + lVar83 * 8 + lVar84);
              dVar23 = *(double *)((long)vfab.p + lVar83 * 8 + lVar79);
              dVar24 = *(double *)(lVar65 + lVar83 * 8);
              dVar25 = *(double *)
                        ((long)vfab.p + lVar83 * 8 + lVar71 + lVar73 + lVar43 * -8 + lVar56 * 8);
              dVar26 = *(double *)(lVar87 + lVar83 * 8);
              dVar27 = *(double *)
                        ((long)vfab.p + lVar83 * 8 + lVar71 + lVar54 + lVar43 * -8 + lVar56 * 8);
              dVar28 = *(double *)(lVar68 + lVar83 * 8);
              dVar29 = *(double *)
                        ((long)vfab.p +
                        lVar83 * 8 + lVar71 + lVar73 + vfab.nstride * 8 + lVar43 * -8 + lVar56 * 8);
              dVar30 = *(double *)(lVar67 + lVar83 * 8);
              dVar31 = *(double *)
                        ((long)vfab.p +
                        lVar83 * 8 + lVar71 + lVar54 + vfab.nstride * 8 + lVar43 * -8 + lVar56 * 8);
              dVar32 = *(double *)(lVar49 + lVar83 * 8);
              dVar33 = *(double *)
                        ((long)vfab.p +
                        lVar83 * 8 + lVar71 + lVar73 + lVar74 + lVar43 * -8 + lVar56 * 8);
              dVar34 = *(double *)(local_4a0 + lVar83 * 8);
              dVar35 = *(double *)
                        ((long)vfab.p +
                        lVar83 * 8 + lVar71 + lVar54 + lVar74 + lVar43 * -8 + lVar56 * 8);
              *(double *)(local_4a8 + lVar83 * 8) =
                   (((*(double *)(lVar58 + lVar83 * 8) +
                     *(double *)((long)vfab.p + lVar83 * 8 + lVar1 + 8)) - *pdVar5) - *pdVar6) *
                   dVar90;
              *(double *)(local_490 + lVar83 * 8) = (((dVar10 + dVar11) - dVar12) - dVar16) * dVar90
              ;
              *(double *)(local_488 + lVar83 * 8) = (((dVar13 + dVar14) - dVar15) - dVar17) * dVar90
              ;
              *(double *)(local_480 + lVar83 * 8) = (dVar18 - dVar21) * dVar8;
              *(double *)(local_478 + lVar83 * 8) = (dVar19 - dVar22) * dVar8;
              *(double *)(local_558 + lVar83 * 8) = (dVar20 - dVar23) * dVar8;
              *(double *)(local_498 + lVar83 * 8) = (((dVar24 + dVar25) - dVar26) - dVar27) * dVar92
              ;
              *(double *)(lVar52 + lVar83 * 8) = (((dVar28 + dVar29) - dVar30) - dVar31) * dVar92;
              *(double *)(lVar80 + lVar83 * 8) = (((dVar32 + dVar33) - dVar34) - dVar35) * dVar92;
              lVar83 = lVar83 + 1;
            } while ((ybx.bigend.vect[0] - ybx.smallend.vect[0]) + 1 != (int)lVar83);
          }
          local_4a0 = local_4a0 + lVar66;
          lVar67 = lVar67 + lVar66;
          lVar87 = lVar87 + lVar66;
          lVar49 = lVar49 + lVar66;
          lVar68 = lVar68 + lVar66;
          lVar65 = lVar65 + lVar66;
          lVar86 = lVar86 + lVar66;
          lVar44 = lVar44 + lVar66;
          lVar58 = lVar58 + lVar66;
          iVar46 = iVar46 + 1;
          local_4a8 = local_4a8 + lVar53;
          local_490 = local_490 + lVar53;
          local_488 = local_488 + lVar53;
          local_480 = local_480 + lVar53;
          local_478 = local_478 + lVar53;
          local_558 = local_558 + lVar53;
          local_498 = local_498 + lVar53;
          lVar52 = lVar52 + lVar53;
          lVar80 = lVar80 + lVar53;
        }
        iVar75 = iVar75 + 1;
        local_4f0 = local_4f0 + lVar48;
        local_4f8 = local_4f8 + lVar48;
        local_500 = local_500 + lVar48;
        local_508 = local_508 + lVar48;
        local_510 = local_510 + lVar48;
        local_518 = local_518 + lVar48;
        local_520 = local_520 + lVar48;
        local_528 = local_528 + lVar48;
        local_530 = local_530 + lVar48;
      }
      lVar72 = (long)zbx.smallend.vect[2];
      lVar67 = (long)zbx.smallend.vect[0] * 8;
      local_388 = fluxfab_tmp._M_elems[2].super_BaseFab<double>.dptr +
                  ((long)zbx.smallend.vect[0] -
                  (long)fluxfab_tmp._M_elems[2].super_BaseFab<double>.domain.smallend.vect[0]);
      lVar68 = lVar72 - lVar70;
      lVar53 = lVar72 * 8;
      lVar42 = lVar72 * 8;
      lVar48 = lVar72 * 8;
      lVar49 = lVar72 * 8;
      lVar56 = lVar72 * 8;
      lVar57 = lVar72 * 8;
      lVar65 = lVar72 * 8;
      lVar66 = lVar72 * 8;
      iVar85 = zbx.smallend.vect[2] + -1;
      for (; lVar72 <= zbx.bigend.vect[2]; lVar72 = lVar72 + 1) {
        lVar80 = (long)vfab.begin.x;
        lVar87 = (long)(iVar85 - vfab.begin.z) * vfab.kstride * 8;
        lVar79 = lVar87 + vfab.nstride * 0x10 + lVar80 * -8;
        lVar52 = lVar79 + lVar67;
        lVar84 = lVar87 + vfab.nstride * 8 + lVar80 * -8;
        lVar43 = lVar84 + lVar67;
        lVar87 = lVar87 + lVar80 * -8;
        lVar76 = vfab.kstride * 8 * (lVar72 - vfab.begin.z);
        lVar88 = vfab.nstride * 0x10 + lVar76 + lVar80 * -8;
        lVar86 = lVar76 + vfab.nstride * 8 + lVar80 * -8;
        lVar76 = lVar76 + lVar80 * -8;
        lVar44 = lVar87 + lVar67;
        lVar54 = lVar88 + lVar67;
        lVar74 = lVar86 + lVar67;
        lVar58 = lVar76 + lVar67;
        lVar80 = vfab.jstride * 8;
        lVar73 = (long)zbx.smallend.vect[1];
        while (lVar73 <= zbx.bigend.vect[1]) {
          if (zbx.bigend.vect[0] < zbx.smallend.vect[0]) {
            lVar73 = lVar73 + 1;
          }
          else {
            lVar45 = vfab.jstride * (lVar73 - vfab.begin.y);
            lVar1 = lVar73 + 1;
            lVar89 = ((int)lVar1 - vfab.begin.y) * lVar80;
            lVar64 = (~vfab.begin.y + (int)lVar73) * lVar80;
            lVar60 = (lVar73 - vfab.begin.y) * lVar80;
            lVar63 = lVar60 + lVar79 + lVar67 + 8;
            lVar78 = lVar60 + lVar84 + 8 + lVar67;
            lVar81 = lVar60 + lVar87 + 8 + lVar67;
            lVar82 = lVar60 + lVar88 + 8 + lVar67;
            lVar39 = lVar60 + lVar86 + 8 + lVar67;
            lVar60 = lVar60 + lVar76 + 8 + lVar67;
            lVar71 = lVar73 * 8;
            lVar83 = lVar73 * 8;
            lVar55 = lVar73 * 8;
            lVar2 = lVar73 * 8;
            lVar3 = lVar73 * 8;
            lVar4 = lVar73 * 8;
            lVar59 = lVar73 * 8;
            lVar61 = lVar73 * 8;
            lVar62 = lVar73 * 8;
            lVar77 = 0;
            do {
              lVar73 = (long)(((zbx.smallend.vect[0] + -1) - vfab.begin.x) + (int)lVar77);
              pdVar5 = vfab.p + lVar45 + lVar73 + vfab.kstride * (lVar72 - vfab.begin.z);
              dVar10 = *(double *)((long)vfab.p + lVar77 * 8 + lVar39);
              dVar11 = *(double *)((long)vfab.p + lVar77 * 8 + lVar78);
              dVar12 = pdVar5[vfab.nstride];
              dVar13 = *(double *)((long)vfab.p + lVar77 * 8 + lVar82);
              dVar14 = *(double *)((long)vfab.p + lVar77 * 8 + lVar63);
              dVar15 = pdVar5[vfab.nstride * 2];
              pdVar6 = vfab.p + lVar45 + lVar73 + (~vfab.begin.z + (int)lVar72) * vfab.kstride;
              dVar16 = pdVar6[vfab.nstride];
              dVar17 = pdVar6[vfab.nstride * 2];
              dVar18 = *(double *)((long)vfab.p + lVar77 * 8 + lVar60 + -8);
              dVar19 = *(double *)((long)vfab.p + lVar77 * 8 + lVar39 + -8);
              dVar20 = *(double *)((long)vfab.p + lVar77 * 8 + lVar82 + -8);
              dVar21 = *(double *)((long)vfab.p + lVar77 * 8 + lVar89 + lVar58);
              dVar22 = *(double *)((long)vfab.p + lVar77 * 8 + lVar89 + lVar44);
              dVar23 = *(double *)((long)vfab.p + lVar77 * 8 + lVar64 + lVar58);
              dVar24 = *(double *)((long)vfab.p + lVar77 * 8 + lVar64 + lVar44);
              dVar25 = *(double *)((long)vfab.p + lVar77 * 8 + lVar89 + lVar74);
              dVar26 = *(double *)((long)vfab.p + lVar77 * 8 + lVar89 + lVar43);
              dVar27 = *(double *)((long)vfab.p + lVar77 * 8 + lVar64 + lVar74);
              dVar28 = *(double *)((long)vfab.p + lVar77 * 8 + lVar64 + lVar43);
              dVar29 = *(double *)((long)vfab.p + lVar77 * 8 + lVar89 + lVar54);
              dVar30 = *(double *)((long)vfab.p + lVar77 * 8 + lVar89 + lVar52);
              dVar31 = *(double *)((long)vfab.p + lVar77 * 8 + lVar64 + lVar54);
              dVar32 = *(double *)((long)vfab.p + lVar77 * 8 + lVar64 + lVar52);
              dVar33 = *(double *)((long)vfab.p + lVar77 * 8 + lVar81 + -8);
              dVar34 = *(double *)((long)vfab.p + lVar77 * 8 + lVar78 + -8);
              dVar35 = *(double *)((long)vfab.p + lVar77 * 8 + lVar63 + -8);
              *(double *)
               ((long)local_388 + lVar77 * 8 + (lVar68 * lVar50 * 8 + lVar69 * -8 + lVar71) * lVar47
               ) = (((*(double *)((long)vfab.p + lVar77 * 8 + lVar60) +
                     *(double *)((long)vfab.p + lVar77 * 8 + lVar81)) - *pdVar5) - *pdVar6) * dVar90
              ;
              *(double *)
               ((long)local_388 +
               lVar77 * 8 +
               ((lVar51 * 8 + lVar53 + lVar70 * -8) * lVar50 + lVar69 * -8 + lVar83) * lVar47) =
                   (((dVar10 + dVar11) - dVar12) - dVar16) * dVar90;
              *(double *)
               ((long)local_388 +
               lVar77 * 8 +
               ((lVar51 * 0x10 + lVar42 + lVar70 * -8) * lVar50 + lVar69 * -8 + lVar55) * lVar47) =
                   (((dVar13 + dVar14) - dVar15) - dVar17) * dVar90;
              *(double *)
               ((long)local_388 +
               lVar77 * 8 +
               ((lVar51 * 0x18 + lVar48 + lVar70 * -8) * lVar50 + lVar69 * -8 + lVar2) * lVar47) =
                   (((dVar21 + dVar22) - dVar23) - dVar24) * dVar91;
              *(double *)
               ((long)local_388 +
               lVar77 * 8 +
               ((lVar51 * 0x20 + lVar49 + lVar70 * -8) * lVar50 + lVar69 * -8 + lVar3) * lVar47) =
                   (((dVar25 + dVar26) - dVar27) - dVar28) * dVar91;
              *(double *)
               ((long)local_388 +
               lVar77 * 8 +
               ((lVar51 * 0x28 + lVar56 + lVar70 * -8) * lVar50 + lVar69 * -8 + lVar4) * lVar47) =
                   (((dVar29 + dVar30) - dVar31) - dVar32) * dVar91;
              *(double *)
               ((long)local_388 +
               lVar77 * 8 +
               ((lVar51 * 0x30 + lVar57 + lVar70 * -8) * lVar50 + lVar69 * -8 + lVar59) * lVar47) =
                   (dVar18 - dVar33) * dVar9;
              *(double *)
               ((long)local_388 +
               lVar77 * 8 +
               ((lVar51 * 0x38 + lVar65 + lVar70 * -8) * lVar50 + lVar69 * -8 + lVar61) * lVar47) =
                   (dVar19 - dVar34) * dVar9;
              *(double *)
               ((long)local_388 +
               lVar77 * 8 +
               ((lVar51 * 0x40 + lVar66 + lVar70 * -8) * lVar50 + lVar69 * -8 + lVar62) * lVar47) =
                   (dVar20 - dVar35) * dVar9;
              lVar77 = lVar77 + 1;
              lVar73 = lVar1;
            } while ((zbx.bigend.vect[0] - zbx.smallend.vect[0]) + 1 != (int)lVar77);
          }
        }
        iVar85 = iVar85 + 1;
        local_388 = local_388 + lVar50 * lVar47;
      }
      for (lVar53 = 0; lVar53 != 3; lVar53 = lVar53 + 1) {
        MFIter::nodaltilebox(&local_258,&mfi,(int)lVar53);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&dst,&fluxes->_M_elems[lVar53]->super_FabArray<amrex::FArrayBox>,&mfi);
        iVar85 = fluxfab_tmp._M_elems[lVar53].super_BaseFab<double>.domain.smallend.vect[0];
        iVar75 = fluxfab_tmp._M_elems[lVar53].super_BaseFab<double>.domain.smallend.vect[1];
        iVar46 = fluxfab_tmp._M_elems[lVar53].super_BaseFab<double>.domain.smallend.vect[2];
        iVar38 = fluxfab_tmp._M_elems[lVar53].super_BaseFab<double>.domain.bigend.vect[2];
        lVar42 = (long)((fluxfab_tmp._M_elems[lVar53].super_BaseFab<double>.domain.bigend.vect[0] -
                        iVar85) + 1);
        lVar49 = (long)((fluxfab_tmp._M_elems[lVar53].super_BaseFab<double>.domain.bigend.vect[1] -
                        iVar75) + 1);
        lVar47 = (long)local_258.smallend.vect[1];
        lVar48 = (lVar47 * 8 + ((long)local_258.smallend.vect[2] - (long)iVar46) * lVar49 * 8 +
                 (long)iVar75 * -8) * lVar42 + (long)local_258.smallend.vect[0] * 8 +
                 (long)iVar85 * -8 + (long)fluxfab_tmp._M_elems[lVar53].super_BaseFab<double>.dptr;
        lVar50 = lVar49 * lVar42 * 8;
        local_588 = 0;
        for (lVar49 = 0; lVar51 = lVar48, lVar56 = (long)local_258.smallend.vect[2], lVar49 != 9;
            lVar49 = lVar49 + 1) {
          for (; lVar56 <= local_258.bigend.vect[2]; lVar56 = lVar56 + 1) {
            lVar66 = (long)dst.p +
                     dst.nstride * local_588 +
                     (lVar47 - dst.begin.y) * dst.jstride * 8 +
                     (lVar56 - dst.begin.z) * dst.kstride * 8 + (long)dst.begin.x * -8 +
                     (long)local_258.smallend.vect[0] * 8;
            lVar57 = lVar51;
            for (lVar65 = lVar47; lVar65 <= local_258.bigend.vect[1]; lVar65 = lVar65 + 1) {
              if (local_258.smallend.vect[0] <= local_258.bigend.vect[0]) {
                lVar67 = 0;
                do {
                  *(undefined8 *)(lVar66 + lVar67 * 8) = *(undefined8 *)(lVar57 + lVar67 * 8);
                  lVar67 = lVar67 + 1;
                } while ((local_258.bigend.vect[0] - local_258.smallend.vect[0]) + 1 != (int)lVar67)
                ;
              }
              lVar66 = lVar66 + dst.jstride * 8;
              lVar57 = lVar57 + lVar42 * 8;
            }
            lVar51 = lVar51 + lVar50;
          }
          local_588 = local_588 + 8;
          lVar48 = lVar48 + ((iVar38 - iVar46) + 1) * lVar50;
        }
      }
      Gpu::Elixir::~Elixir(&fzeli);
      Gpu::Elixir::~Elixir(&fyeli);
      Gpu::Elixir::~Elixir(&fxeli);
    }
    else {
      piVar41 = &mfi.currentIndex;
      if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar41 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start + mfi.currentIndex;
      }
      FVar40 = EBCellFlagFab::getType
                         ((local_3a8->m_fabs_v).
                          super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[*piVar41],&local_60);
      if (FVar40 != covered) {
        if (FVar40 == regular) goto LAB_005a97f6;
        Abort_host("compVelGrad not yet implemented for cut-cells  ");
      }
    }
    MFIter::operator++(&mfi);
  } while( true );
}

Assistant:

void
MLEBTensorOp::compVelGrad (int amrlev, const Array<MultiFab*,AMREX_SPACEDIM>& fluxes,
                       MultiFab& sol, Location loc) const
{
    BL_PROFILE("MLEBTensorOp::compVelGrad()");

    if ( !(loc==Location::FaceCenter || loc==Location::FaceCentroid) )
      amrex::Abort("MLEBTensorOp::compVelGrad() unknown location for VelGradients.");

    const int mglev = 0;

    applyBCTensor(amrlev, mglev, sol, BCMode::Inhomogeneous, StateMode::Solution, m_bndry_sol[amrlev].get());

    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][mglev].get());
    const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;

    const Geometry& geom = m_geom[amrlev][mglev];
    const auto dxinv = geom.InvCellSizeArray();

    const int dim_fluxes = AMREX_SPACEDIM*AMREX_SPACEDIM;

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
  {
    Array<FArrayBox,AMREX_SPACEDIM> fluxfab_tmp;
    for (MFIter mfi(sol, mfi_info); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();

        auto fabtyp = (flags) ? (*flags)[mfi].getType(bx) : FabType::regular;
        if (fabtyp == FabType::covered) continue;

        if (fabtyp == FabType::regular)
        {

            Array4<Real const> const vfab = sol.const_array(mfi);
            AMREX_D_TERM(Box const xbx = mfi.nodaltilebox(0);,
                         Box const ybx = mfi.nodaltilebox(1);,
                         Box const zbx = mfi.nodaltilebox(2););
            AMREX_D_TERM(fluxfab_tmp[0].resize(xbx,dim_fluxes);,
                         fluxfab_tmp[1].resize(ybx,dim_fluxes);,
                         fluxfab_tmp[2].resize(zbx,dim_fluxes););
            AMREX_D_TERM(Elixir fxeli = fluxfab_tmp[0].elixir();,
                         Elixir fyeli = fluxfab_tmp[1].elixir();,
                         Elixir fzeli = fluxfab_tmp[2].elixir(););
            AMREX_D_TERM(Array4<Real> const fxfab = fluxfab_tmp[0].array();,
                         Array4<Real> const fyfab = fluxfab_tmp[1].array();,
                         Array4<Real> const fzfab = fluxfab_tmp[2].array(););
            AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM
            ( xbx, txbx,
              {
                  mltensor_vel_grads_fx(txbx,fxfab,vfab,dxinv);
              }
            , ybx, tybx,
              {
                  mltensor_vel_grads_fy(tybx,fyfab,vfab,dxinv);
              }
            , zbx, tzbx,
              {
                  mltensor_vel_grads_fz(tzbx,fzfab,vfab,dxinv);
              }
            );

// The derivatives are put in the array with the following order:
// component: 0    ,  1    ,  2    ,  3    ,  4    , 5    ,  6    ,  7    ,  8
// in 2D:     dU/dx,  dV/dx,  dU/dy,  dV/dy
// in 3D:     dU/dx,  dV/dx,  dW/dx,  dU/dy,  dV/dy, dW/dy,  dU/dz,  dV/dz,  dW/dz


            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                const Box& nbx = mfi.nodaltilebox(idim);
                Array4<Real      > dst = fluxes[idim]->array(mfi);
                Array4<Real const> src = fluxfab_tmp[idim].const_array();
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D (nbx, dim_fluxes, i, j, k, n,
                {
                    dst(i,j,k,n) = src(i,j,k,n);
                });
            }


        }
        else if ( loc==Location::FaceCenter )
        {

          amrex::Abort("compVelGrad not yet implemented for cut-cells  ");

        }
        else // loc==Location::FaceCentroid
        {

          amrex::Abort("compVelGrad not yet implemented for cut-cells  ");

        }

    }
  }
}